

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

Byte ppmd_read(void *p)

{
  long *plVar1;
  archive_read *a;
  void *pvVar2;
  Byte BVar3;
  Byte *pBVar4;
  ssize_t bytes_avail;
  ssize_t local_28;
  
  a = *p;
  pvVar2 = a->format->data;
  local_28 = 0;
  pBVar4 = (Byte *)__archive_read_ahead(a,1,&local_28);
  if (local_28 < 1) {
    *(undefined1 *)((long)pvVar2 + 0x1ec9) = 1;
    BVar3 = '\0';
  }
  else {
    __archive_read_consume(a,1);
    plVar1 = (long *)((long)pvVar2 + 0x1e0);
    *plVar1 = *plVar1 + 1;
    BVar3 = *pBVar4;
  }
  return BVar3;
}

Assistant:

static Byte
ppmd_read(void *p)
{
  struct archive_read *a = ((IByteIn*)p)->a;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  Byte b;
  if (!rar_br_read_ahead(a, br, 8))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Truncated RAR file data");
    rar->valid = 0;
    return 0;
  }
  b = rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return b;
}